

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O3

MPP_RET dec_vproc_init(MppDecVprocCtx *ctx,MppDecVprocCfg *cfg)

{
  void *pvVar1;
  MPP_RET MVar2;
  long *ctx_00;
  MppThread *pMVar3;
  iep_com_ctx *piVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  HalTaskGroup *group;
  bool bVar8;
  
  if (cfg->mpp == (void *)0x0 || (cfg == (MppDecVprocCfg *)0x0 || ctx == (MppDecVprocCtx *)0x0)) {
    _mpp_log_l(2,"mpp_dec_vproc","found NULL input ctx %p mpp %p\n","dec_vproc_init",ctx);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)vproc_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","in\n","dec_vproc_init");
    }
    mpp_env_get_u32("vproc_debug",&vproc_debug,0);
    *ctx = (MppDecVprocCtx)0x0;
    ctx_00 = (long *)mpp_osal_calloc("dec_vproc_init",0xe8);
    if (ctx_00 == (long *)0x0) {
      _mpp_log_l(2,"mpp_dec_vproc","malloc failed\n","dec_vproc_init");
    }
    else {
      *(undefined4 *)(ctx_00 + 0x16) = 2;
      pvVar1 = cfg->mpp;
      *ctx_00 = (long)pvVar1;
      ctx_00[2] = *(long *)(*(long *)((long)pvVar1 + 0xa8) + 0x30);
      pMVar3 = (MppThread *)operator_new(0x198);
      MppThread::MppThread(pMVar3,dec_vproc_thread,ctx_00,"mpp_dec_vproc");
      ctx_00[3] = (long)pMVar3;
      sem_init((sem_t *)(ctx_00 + 5),0,0);
      group = (HalTaskGroup *)(ctx_00 + 1);
      MVar2 = hal_task_group_init(group,3,4,8);
      if (MVar2 == MPP_OK) {
        cfg->task_group = (HalTaskGroup)ctx_00[1];
        piVar4 = get_iep_ctx();
        ctx_00[10] = (long)piVar4;
        if (piVar4 != (iep_com_ctx *)0x0) {
          bVar8 = piVar4->ver == 1;
          pcVar6 = dec_vproc_start_dei_v2;
          if (bVar8) {
            pcVar6 = dec_vproc_start_dei_v1;
          }
          pcVar7 = dec_vproc_set_dei_v2;
          if (bVar8) {
            pcVar7 = dec_vproc_set_dei_v1;
          }
          pcVar5 = dec_vproc_update_ref_v2;
          if (bVar8) {
            pcVar5 = dec_vproc_update_ref_v1;
          }
          ctx_00[0x1b] = (long)pcVar6;
          ctx_00[0x1a] = (long)pcVar7;
          ctx_00[0x1c] = (long)pcVar5;
          MVar2 = (*piVar4->ops->init)(&piVar4->priv);
          ctx_00[9] = *(long *)(ctx_00[10] + 8);
          if ((MVar2 == MPP_OK) && (ctx_00[3] != 0)) {
            ctx_00[0xb] = 0x100000001;
            ctx_00[0xc] = 0x4000000000;
            *(undefined4 *)(ctx_00 + 0xd) = 0;
            *(undefined4 *)((long)ctx_00 + 0x6c) = 1;
            *(undefined4 *)(ctx_00 + 0xe) = 0;
            *(undefined4 *)((long)ctx_00 + 0x74) = 2;
            *(undefined4 *)((long)ctx_00 + 0x94) = 0xffffffff;
            ctx_00[0x13] = 0;
            *(undefined4 *)(ctx_00 + 0x14) = 0xffffffff;
            ctx_00[0x15] = 0;
          }
          else {
            _mpp_log_l(2,"mpp_dec_vproc","failed to create context\n",(char *)0x0);
            pMVar3 = (MppThread *)ctx_00[3];
            if (pMVar3 != (MppThread *)0x0) {
              MppThread::~MppThread(pMVar3);
              operator_delete(pMVar3,0x198);
              ctx_00[3] = 0;
            }
            if (ctx_00[9] != 0) {
              (**(code **)(*(long *)ctx_00[10] + 8))();
            }
            if (*group != (HalTaskGroup)0x0) {
              hal_task_group_deinit(*group);
              *group = (HalTaskGroup)0x0;
            }
            put_iep_ctx((iep_com_ctx *)ctx_00[10]);
            mpp_osal_free("dec_vproc_init",ctx_00);
            ctx_00 = (long *)0x0;
          }
          *ctx = ctx_00;
          if (((byte)vproc_debug & 1) == 0) {
            return MVar2;
          }
          _mpp_log_l(4,"mpp_dec_vproc","out\n","dec_vproc_init");
          return MVar2;
        }
        _mpp_log_l(2,"mpp_dec_vproc","failed to require context\n",(char *)0x0);
        pMVar3 = (MppThread *)ctx_00[3];
        if (pMVar3 != (MppThread *)0x0) {
          MppThread::~MppThread(pMVar3);
        }
        operator_delete(pMVar3,0x198);
        if (*group != (HalTaskGroup)0x0) {
          hal_task_group_deinit(*group);
          *group = (HalTaskGroup)0x0;
        }
      }
      else {
        _mpp_log_l(2,"mpp_dec_vproc","create task group failed\n","dec_vproc_init");
        pMVar3 = (MppThread *)ctx_00[3];
        if (pMVar3 != (MppThread *)0x0) {
          MppThread::~MppThread(pMVar3);
        }
        operator_delete(pMVar3,0x198);
      }
      mpp_osal_free("dec_vproc_init",ctx_00);
    }
    MVar2 = MPP_ERR_MALLOC;
  }
  return MVar2;
}

Assistant:

MPP_RET dec_vproc_init(MppDecVprocCtx *ctx, MppDecVprocCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    if (NULL == ctx || NULL == cfg || NULL == cfg->mpp) {
        mpp_err_f("found NULL input ctx %p mpp %p\n", ctx, cfg->mpp);
        return MPP_ERR_NULL_PTR;
    }

    vproc_dbg_func("in\n");
    mpp_env_get_u32("vproc_debug", &vproc_debug, 0);

    *ctx = NULL;

    MppDecVprocCtxImpl *p = mpp_calloc(MppDecVprocCtxImpl, 1);
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_MALLOC;
    }

    p->pre_ff_mode = IEP2_FF_MODE_UND;
    p->mpp = (Mpp *)cfg->mpp;
    p->slots = ((MppDecImpl *)p->mpp->mDec)->frame_slots;
    p->thd = new MppThread(dec_vproc_thread, p, "mpp_dec_vproc");
    sem_init(&p->reset_sem, 0, 0);
    ret = hal_task_group_init(&p->task_group, TASK_BUTT, 4, sizeof(HalDecVprocTask));
    if (ret) {
        mpp_err_f("create task group failed\n");
        delete p->thd;
        MPP_FREE(p);
        return MPP_ERR_MALLOC;
    }
    cfg->task_group = p->task_group;

    p->com_ctx = get_iep_ctx();
    if (!p->com_ctx) {
        mpp_err("failed to require context\n");
        delete p->thd;

        if (p->task_group) {
            hal_task_group_deinit(p->task_group);
            p->task_group = NULL;
        }

        MPP_FREE(p);

        return MPP_ERR_MALLOC;
    }

    if (p->com_ctx->ver == 1) {
        p->start_dei = dec_vproc_start_dei_v1;
        p->set_dei = dec_vproc_set_dei_v1;
        p->update_ref = dec_vproc_update_ref_v1;
    } else {
        p->start_dei = dec_vproc_start_dei_v2;
        p->set_dei = dec_vproc_set_dei_v2;
        p->update_ref = dec_vproc_update_ref_v2;
    }

    ret = p->com_ctx->ops->init(&p->com_ctx->priv);
    p->iep_ctx = p->com_ctx->priv;
    if (!p->thd || ret) {
        mpp_err("failed to create context\n");
        if (p->thd) {
            delete p->thd;
            p->thd = NULL;
        }

        if (p->iep_ctx)
            p->com_ctx->ops->deinit(p->iep_ctx);

        if (p->task_group) {
            hal_task_group_deinit(p->task_group);
            p->task_group = NULL;
        }

        put_iep_ctx(p->com_ctx);

        MPP_FREE(p);
    } else {
        p->dei_cfg.dei_mode = IEP_DEI_MODE_I2O1;
        p->dei_cfg.dei_field_order = IEP_DEI_FLD_ORDER_BOT_FIRST;
        /*
         * We need to turn off this switch to prevent some areas
         * of the video from flickering.
         */
        p->dei_cfg.dei_high_freq_en = 0;
        p->dei_cfg.dei_high_freq_fct = 64;
        p->dei_cfg.dei_ei_mode = 0;
        p->dei_cfg.dei_ei_smooth = 1;
        p->dei_cfg.dei_ei_sel = 0;
        p->dei_cfg.dei_ei_radius = 2;

        p->prev_idx0 = -1;
        p->prev_frm0 = NULL;
        p->prev_idx1 = -1;
        p->prev_frm1 = NULL;
    }

    *ctx = p;

    vproc_dbg_func("out\n");
    return ret;
}